

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

_incompatible_texture_target_pairs *
gl4cts::TextureViewUtilities::getIllegalTextureAndViewTargetCombinations(void)

{
  GLenum original_texture_target;
  GLenum view_texture_target;
  bool bVar1;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *in_RDI;
  long lVar2;
  pair<unsigned_int,_unsigned_int> local_40;
  long local_38;
  
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  for (local_38 = 0; local_38 != 0xb; local_38 = local_38 + 1) {
    original_texture_target = (&valid_texture_targets)[local_38];
    for (lVar2 = 0; lVar2 != 0x2c; lVar2 = lVar2 + 4) {
      view_texture_target = *(GLenum *)((long)&valid_texture_targets + lVar2);
      bVar1 = isLegalTextureTargetForTextureView(original_texture_target,view_texture_target);
      if (!bVar1) {
        local_40.first = original_texture_target;
        local_40.second = view_texture_target;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<std::pair<unsigned_int,unsigned_int>>(in_RDI,&local_40);
      }
    }
  }
  return (_incompatible_texture_target_pairs *)in_RDI;
}

Assistant:

TextureViewUtilities::_incompatible_texture_target_pairs TextureViewUtilities::
	getIllegalTextureAndViewTargetCombinations()
{
	_incompatible_texture_target_pairs result;

	/* Iterate through all combinations of texture targets and store those that are
	 * reported as invalid
	 */
	for (unsigned int n_parent_texture_target = 0; n_parent_texture_target < n_valid_texture_targets;
		 ++n_parent_texture_target)
	{
		glw::GLenum parent_texture_target = valid_texture_targets[n_parent_texture_target];

		for (unsigned int n_view_texture_target = 0; n_view_texture_target < n_valid_texture_targets;
			 ++n_view_texture_target)
		{
			glw::GLenum view_texture_target = valid_texture_targets[n_view_texture_target];

			if (!isLegalTextureTargetForTextureView(parent_texture_target, view_texture_target))
			{
				result.push_back(_internalformat_pair(parent_texture_target, view_texture_target));
			}
		} /* for (all texture targets considered for views) */
	}	 /* for (all texture targets considered for parent texture) */

	return result;
}